

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teamcity_boost.cpp
# Opt level: O2

void __thiscall
jetbrains::teamcity::TeamcityBoostLogFormatter::log_entry_start
          (TeamcityBoostLogFormatter *this,ostream *param_1,log_entry_data *entry_data,
          log_entry_types param_3)

{
  ostream *poVar1;
  string asStack_1b8 [32];
  stringstream ss;
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,_S_out);
  poVar1 = std::operator<<(local_188,(string *)entry_data);
  poVar1 = std::operator<<(poVar1,':');
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,": ");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::append((string *)&this->currentDetails);
  std::__cxx11::string::~string(asStack_1b8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

void TeamcityBoostLogFormatter::log_entry_start(
    std::ostream& /*out*/
  , const boost::unit_test::log_entry_data& entry_data
  , log_entry_types /*let*/
  )
{
    std::stringstream ss(std::ios_base::out);
    ss  << entry_data.m_file_name << ':' << entry_data.m_line_num << ": ";
    currentDetails += ss.str();
}